

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

void __thiscall Symbol::print(Symbol *this)

{
  ostream *poVar1;
  void *pvVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  int local_24;
  int local_20;
  int j_1;
  int j;
  int i_2;
  int i_1;
  int i;
  Symbol *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Name: ");
  poVar1 = std::operator<<(poVar1,(string *)this);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if (this->type_ == kInt) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Int Value: ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,(this->value_).int_value);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Is Assigned: ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(this->is_assigned_ & 1));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (this->type_ == kIntArray) {
    std::operator<<((ostream *)&std::cout,"Int Array: ");
    for (i_2 = 0; sVar3 = std::vector<int,_std::allocator<int>_>::size(&(this->value_).int_array),
        i_2 < (int)sVar3; i_2 = i_2 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(this->value_).int_array,(long)i_2);
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar4);
      std::operator<<(poVar1," ");
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Is Assigned: ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(this->is_assigned_ & 1));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (this->type_ == kReal) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Real Value: ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,(this->value_).real_value);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Is Assigned: ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(this->is_assigned_ & 1));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (this->type_ == kRealArray) {
    std::operator<<((ostream *)&std::cout,"Real Array: ");
    for (j = 0; sVar3 = std::vector<double,_std::allocator<double>_>::size
                                  (&(this->value_).real_array), j < (int)sVar3; j = j + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(this->value_).real_array,(long)j);
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar5);
      std::operator<<(poVar1," ");
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"Is Assigned: ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(this->is_assigned_ & 1));
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (this->type_ == kFunction) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Method Args: ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    for (j_1 = 0; sVar3 = std::vector<Symbol,_std::allocator<Symbol>_>::size(&(this->value_).args),
        j_1 < (int)sVar3; j_1 = j_1 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,"    Arg ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,j_1 + 1);
      poVar1 = std::operator<<(poVar1,anon_var_dwarf_a345 + 0xc);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      poVar1 = std::operator<<((ostream *)&std::cout,"        Name: ");
      pvVar6 = std::vector<Symbol,_std::allocator<Symbol>_>::operator[]
                         (&(this->value_).args,(long)j_1);
      poVar1 = std::operator<<(poVar1,(string *)pvVar6);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      pvVar6 = std::vector<Symbol,_std::allocator<Symbol>_>::operator[]
                         (&(this->value_).args,(long)j_1);
      if (pvVar6->type_ == kInt) {
        poVar1 = std::operator<<((ostream *)&std::cout,"        Int Value: ");
        pvVar6 = std::vector<Symbol,_std::allocator<Symbol>_>::operator[]
                           (&(this->value_).args,(long)j_1);
        pvVar2 = (void *)std::ostream::operator<<(poVar1,(pvVar6->value_).int_value);
        std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
        poVar1 = std::operator<<((ostream *)&std::cout,"        Is Assigned: ");
        pvVar6 = std::vector<Symbol,_std::allocator<Symbol>_>::operator[]
                           (&(this->value_).args,(long)j_1);
        pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(pvVar6->is_assigned_ & 1));
        std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        pvVar6 = std::vector<Symbol,_std::allocator<Symbol>_>::operator[]
                           (&(this->value_).args,(long)j_1);
        if (pvVar6->type_ == kIntArray) {
          std::operator<<((ostream *)&std::cout,"        Int Array: ");
          local_20 = 0;
          while( true ) {
            pvVar6 = std::vector<Symbol,_std::allocator<Symbol>_>::operator[]
                               (&(this->value_).args,(long)local_20);
            sVar3 = std::vector<int,_std::allocator<int>_>::size(&(pvVar6->value_).int_array);
            if ((int)sVar3 <= local_20) break;
            pvVar6 = std::vector<Symbol,_std::allocator<Symbol>_>::operator[]
                               (&(this->value_).args,(long)local_20);
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(pvVar6->value_).int_array,(long)local_20);
            poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar4);
            std::operator<<(poVar1," ");
            local_20 = local_20 + 1;
          }
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          poVar1 = std::operator<<((ostream *)&std::cout,"        Is Assigned: ");
          pvVar6 = std::vector<Symbol,_std::allocator<Symbol>_>::operator[]
                             (&(this->value_).args,(long)j_1);
          pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(pvVar6->is_assigned_ & 1));
          std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
        }
        else {
          pvVar6 = std::vector<Symbol,_std::allocator<Symbol>_>::operator[]
                             (&(this->value_).args,(long)j_1);
          if (pvVar6->type_ == kReal) {
            poVar1 = std::operator<<((ostream *)&std::cout,"        Real Value: ");
            pvVar6 = std::vector<Symbol,_std::allocator<Symbol>_>::operator[]
                               (&(this->value_).args,(long)j_1);
            pvVar2 = (void *)std::ostream::operator<<(poVar1,(pvVar6->value_).real_value);
            std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
            poVar1 = std::operator<<((ostream *)&std::cout,"        Is Assigned: ");
            pvVar6 = std::vector<Symbol,_std::allocator<Symbol>_>::operator[]
                               (&(this->value_).args,(long)j_1);
            pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(pvVar6->is_assigned_ & 1));
            std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
          }
          else {
            pvVar6 = std::vector<Symbol,_std::allocator<Symbol>_>::operator[]
                               (&(this->value_).args,(long)j_1);
            if (pvVar6->type_ == kRealArray) {
              std::operator<<((ostream *)&std::cout,"        Real Array: ");
              local_24 = 0;
              while( true ) {
                pvVar6 = std::vector<Symbol,_std::allocator<Symbol>_>::operator[]
                                   (&(this->value_).args,(long)local_24);
                sVar3 = std::vector<double,_std::allocator<double>_>::size
                                  (&(pvVar6->value_).real_array);
                if ((int)sVar3 <= j_1) break;
                pvVar6 = std::vector<Symbol,_std::allocator<Symbol>_>::operator[]
                                   (&(this->value_).args,(long)local_24);
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   (&(pvVar6->value_).real_array,(long)local_24);
                poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*pvVar5);
                std::operator<<(poVar1," ");
                local_24 = local_24 + 1;
              }
              std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
              poVar1 = std::operator<<((ostream *)&std::cout,"        Is Assigned: ");
              pvVar6 = std::vector<Symbol,_std::allocator<Symbol>_>::operator[]
                                 (&(this->value_).args,(long)j_1);
              pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(pvVar6->is_assigned_ & 1));
              std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
            }
          }
        }
      }
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"===================================");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Symbol::print() const {
    std::cout << "Name: " << name_ << std::endl;
    if (type_ == Symbol::Type::kInt) {
        std::cout << "Int Value: " << value_.int_value << std::endl;
        std::cout << "Is Assigned: " << is_assigned_ << std::endl;
    } else if (type_ == Symbol::Type::kIntArray) {
        std::cout << "Int Array: ";
        for (int i = 0; i < (int)value_.int_array.size(); i++) {
            std::cout << value_.int_array[i] << " ";
        }
        std::cout << std::endl;
        std::cout << "Is Assigned: " << is_assigned_ << std::endl;
    } else if (type_ == Symbol::Type::kReal) {
        std::cout << "Real Value: " << value_.real_value << std::endl;
        std::cout << "Is Assigned: " << is_assigned_ << std::endl;
    } else if (type_ == Symbol::Type::kRealArray) {
        std::cout << "Real Array: ";
        for (int i = 0; i < (int)value_.real_array.size(); i++) {
            std::cout << value_.real_array[i] << " ";
        }
        std::cout << std::endl;
        std::cout << "Is Assigned: " << is_assigned_ << std::endl;
    } else if (type_ == Symbol::Type::kFunction) {
        std::cout << "Method Args: " << std::endl;
        for (int i = 0; i < (int)value_.args.size(); i++) {
            std::cout << "    Arg " << i + 1 << ":" << std::endl;
            std::cout << "        Name: " << value_.args[i].name_ << std::endl;
            if (value_.args[i].type_ == Symbol::Type::kInt) {
                std::cout << "        Int Value: " << value_.args[i].value_.int_value << std::endl;
                std::cout << "        Is Assigned: " << value_.args[i].is_assigned_ << std::endl;
            } else if (value_.args[i].type_ == Symbol::Type::kIntArray) {
                std::cout << "        Int Array: ";
                for (int j = 0; j < (int)value_.args[j].value_.int_array.size(); j++) {
                    std::cout << value_.args[j].value_.int_array[j] << " ";
                }
                std::cout << std::endl;
                std::cout << "        Is Assigned: " << value_.args[i].is_assigned_ << std::endl;
            } else if (value_.args[i].type_ == Symbol::Type::kReal) {
                std::cout << "        Real Value: " << value_.args[i].value_.real_value << std::endl;
                std::cout << "        Is Assigned: " << value_.args[i].is_assigned_ << std::endl;
            } else if (value_.args[i].type_ == Symbol::Type::kRealArray) {
                std::cout << "        Real Array: ";
                for (int j = 0; i < (int) value_.args[j].value_.real_array.size(); j++) {
                    std::cout << value_.args[j].value_.real_array[j] << " ";
                }
                std::cout << std::endl;
                std::cout << "        Is Assigned: " << value_.args[i].is_assigned_ << std::endl;
            }
        }
        std::cout << std::endl;
    }
    std::cout << "===================================" << std::endl;
}